

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::DCA(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  ushort address_00;
  unsigned_short word;
  unsigned_short word_00;
  ostream *poVar1;
  element_type *peVar2;
  unsigned_short mkHigh;
  unsigned_short mkLow;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  address_00 = address - 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"DCA");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address_00);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word = Memory::Read(peVar2,address,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word_00 = Memory::Read(peVar2,address_00,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,address,word);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,address_00,word_00);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,1,word);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,0,word_00);
  return;
}

Assistant:

void egc::Sequencer::DCA (unsigned short instruction)
{
    unsigned short k = (instruction & 001777u) - 000001u;

    std::cout << "DCA" << " " << std::oct << k << std::dec << std::endl;

    auto mkLow = m_Memory->Read(k + 00001u);
    auto mkHigh = m_Memory->Read(k);

    m_Memory->Write(k + 00001u, mkLow);
    m_Memory->Write(k, mkHigh);
    m_Memory->Write(00001u, mkLow);
    m_Memory->Write(00000u, mkHigh);
}